

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

void __thiscall crnlib::dxt3_block::flip_y(dxt3_block *this,uint w,uint h)

{
  uint value;
  uint value_00;
  uint in_EDX;
  uint in_ESI;
  dxt3_block *in_RDI;
  uint c;
  uint x;
  uint y;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < in_EDX >> 1; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      value = get_alpha(in_RDI,local_18,local_14,false);
      value_00 = get_alpha(in_RDI,local_18,(in_EDX - 1) - local_14,false);
      set_alpha(in_RDI,local_18,local_14,value_00,false);
      set_alpha(in_RDI,local_18,(in_EDX - 1) - local_14,value,false);
    }
  }
  return;
}

Assistant:

inline void flip_y(uint w = 4, uint h = 4) {
    for (uint y = 0; y < (h / 2); y++) {
      for (uint x = 0; x < w; x++) {
        const uint c = get_alpha(x, y, false);
        set_alpha(x, y, get_alpha(x, (h - 1) - y, false), false);
        set_alpha(x, (h - 1) - y, c, false);
      }
    }
  }